

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::~Discreet3DSImporter(Discreet3DSImporter *this)

{
  Discreet3DSImporter *this_local;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00dfde48;
  std::__cxx11::string::~string((string *)&this->mBackgroundImage);
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

Discreet3DSImporter::~Discreet3DSImporter() {
    // empty
}